

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::MultiThreadedObjectTest::pushObjectsToShared
          (MultiThreadedObjectTest *this,TestThread *thread)

{
  pointer *pppvVar1;
  pointer *pppVar2;
  pointer *pppVar3;
  iterator iVar4;
  iterator __position;
  iterator __position_00;
  void *pvVar5;
  long lVar6;
  pair<eglu::NativeWindow_*,_void_*> *__args;
  pair<eglu::NativePixmap_*,_void_*> *__args_00;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  
  bVar14 = thread->m_id == 0;
  lVar7 = 0x1b8;
  if (bVar14) {
    lVar7 = 0x1a0;
  }
  lVar10 = 0x170;
  if (bVar14) {
    lVar10 = 0x158;
  }
  lVar9 = 0x128;
  if (bVar14) {
    lVar9 = 0x110;
  }
  lVar6 = 0x200;
  if (bVar14) {
    lVar6 = 0x1e8;
  }
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode._vptr_TestNode + lVar7);
  lVar8 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode.m_testCtx + lVar7);
  if (0 < (int)((ulong)(lVar8 - lVar11) >> 3)) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      iVar4._M_current =
           (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&this->m_sharedPbuffers,iVar4,
                   (void **)(lVar11 + lVar12));
      }
      else {
        *iVar4._M_current = *(void **)(lVar11 + lVar12);
        pppvVar1 = &(this->m_sharedPbuffers).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      lVar13 = lVar13 + 1;
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode._vptr_TestNode + lVar7);
      lVar8 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx + lVar7);
      lVar12 = lVar12 + 8;
    } while (lVar13 < (int)((ulong)(lVar8 - lVar11) >> 3));
  }
  if (lVar8 != lVar11) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar7) = lVar11;
  }
  lVar7 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar10);
  lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar10);
  if (0 < (int)((ulong)(lVar11 - lVar7) >> 4)) {
    lVar8 = 0;
    lVar12 = 0;
    do {
      __args = (pair<eglu::NativeWindow_*,_void_*> *)(lVar7 + lVar8);
      __position._M_current =
           (this->m_sharedNativeWindows).
           super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_sharedNativeWindows).
          super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
        ::_M_realloc_insert<std::pair<eglu::NativeWindow*,void*>const&>
                  ((vector<std::pair<eglu::NativeWindow*,void*>,std::allocator<std::pair<eglu::NativeWindow*,void*>>>
                    *)&this->m_sharedNativeWindows,__position,__args);
      }
      else {
        pvVar5 = __args->second;
        (__position._M_current)->first = __args->first;
        (__position._M_current)->second = pvVar5;
        pppVar2 = &(this->m_sharedNativeWindows).
                   super__Vector_base<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + 1;
      }
      lVar12 = lVar12 + 1;
      lVar7 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar10);
      lVar11 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar10);
      lVar8 = lVar8 + 0x10;
    } while (lVar12 < (int)((ulong)(lVar11 - lVar7) >> 4));
  }
  if (lVar11 != lVar7) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar10) = lVar7;
  }
  lVar7 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar9);
  lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar9);
  if (0 < (int)((ulong)(lVar10 - lVar7) >> 4)) {
    lVar11 = 0;
    lVar8 = 0;
    do {
      __args_00 = (pair<eglu::NativePixmap_*,_void_*> *)(lVar7 + lVar11);
      __position_00._M_current =
           (this->m_sharedNativePixmaps).
           super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_sharedNativePixmaps).
          super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
        ::_M_realloc_insert<std::pair<eglu::NativePixmap*,void*>const&>
                  ((vector<std::pair<eglu::NativePixmap*,void*>,std::allocator<std::pair<eglu::NativePixmap*,void*>>>
                    *)&this->m_sharedNativePixmaps,__position_00,__args_00);
      }
      else {
        pvVar5 = __args_00->second;
        (__position_00._M_current)->first = __args_00->first;
        (__position_00._M_current)->second = pvVar5;
        pppVar3 = &(this->m_sharedNativePixmaps).
                   super__Vector_base<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar3 = *pppVar3 + 1;
      }
      lVar8 = lVar8 + 1;
      lVar7 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar9);
      lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar9);
      lVar11 = lVar11 + 0x10;
    } while (lVar8 < (int)((ulong)(lVar10 - lVar7) >> 4));
  }
  if (lVar10 != lVar7) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar9) = lVar7;
  }
  lVar7 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                           super_TestNode._vptr_TestNode + lVar6);
  lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx + lVar6);
  if (0 < (int)((ulong)(lVar10 - lVar7) >> 3)) {
    lVar9 = 0;
    lVar11 = 0;
    do {
      iVar4._M_current =
           (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&this->m_sharedContexts,iVar4,
                   (void **)(lVar7 + lVar9));
      }
      else {
        *iVar4._M_current = *(void **)(lVar7 + lVar9);
        pppvVar1 = &(this->m_sharedContexts).super__Vector_base<void_*,_std::allocator<void_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      lVar11 = lVar11 + 1;
      lVar7 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                               super_TestNode._vptr_TestNode + lVar6);
      lVar10 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                                super_TestNode.m_testCtx + lVar6);
      lVar9 = lVar9 + 8;
    } while (lVar11 < (int)((ulong)(lVar10 - lVar7) >> 3));
  }
  if (lVar10 != lVar7) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar6) = lVar7;
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::pushObjectsToShared (TestThread& thread)
{
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
		m_sharedPbuffers.push_back(pbuffers[pbufferNdx]);

	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
		m_sharedNativeWindows.push_back(windows[windowNdx]);

	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
		m_sharedNativePixmaps.push_back(pixmaps[pixmapNdx]);

	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
		m_sharedContexts.push_back(contexts[contextNdx]);

	contexts.clear();
}